

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

int32_t __thiscall
fasttext::Dictionary::getLine
          (Dictionary *this,istream *in,vector<int,_std::allocator<int>_> *words,
          vector<int,_std::allocator<int>_> *labels)

{
  pointer piVar1;
  iterator __position;
  bool bVar2;
  entry_type eVar3;
  int32_t iVar4;
  int iVar5;
  long lVar6;
  uint32_t h;
  _Alloc_hider _Var7;
  int32_t iVar8;
  vector<int,_std::allocator<int>_> word_hashes;
  string token;
  uint32_t local_7c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  int *local_68;
  vector<int,_std::allocator<int>_> *local_60;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_78._M_allocated_capacity = 0;
  local_78._8_8_ = (int *)0x0;
  local_68 = (int *)0x0;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  _Var7._M_p = (pointer)this;
  reset(this,in);
  piVar1 = (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar1;
  }
  piVar1 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  iVar8 = 0;
  local_60 = words;
  local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)labels;
  do {
    do {
      bVar2 = readWord((Dictionary *)_Var7._M_p,in,&local_58);
      if (!bVar2) goto LAB_001189fa;
      h = 0x811c9dc5;
      if (local_58._M_string_length != 0) {
        lVar6 = 0;
        do {
          h = ((int)local_58._M_dataplus._M_p[lVar6] ^ h) * 0x1000193;
          lVar6 = lVar6 + 1;
        } while (local_58._M_string_length != lVar6);
      }
      iVar4 = find(this,&local_58,h);
      iVar4 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar4];
      if (iVar4 < 0) {
        _Var7._M_p = (pointer)this;
        eVar3 = getType(this,&local_58);
      }
      else {
        _Var7._M_p = (pointer)this;
        eVar3 = getType(this,iVar4);
      }
      if (eVar3 == word) {
        _Var7._M_p = (pointer)this;
        addSubwords(this,local_60,&local_58,iVar4);
        local_7c = h;
        if ((int *)local_78._8_8_ == local_68) {
          _Var7._M_p = (pointer)&local_78;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)_Var7._M_p,(iterator)local_78._8_8_,
                     (int *)&local_7c);
        }
        else {
          *(uint32_t *)local_78._8_8_ = h;
          local_78._8_8_ = local_78._8_8_ + 4;
        }
      }
      else if (-1 < iVar4 && eVar3 == label) {
        local_7c = iVar4 - this->nwords_;
        __position._M_current = *(int **)((long)local_38 + 8);
        _Var7._M_p = (pointer)local_38;
        if (__position._M_current == *(int **)(local_38->_M_local_buf + 0x10)) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_38,__position,(int *)&local_7c);
        }
        else {
          *__position._M_current = local_7c;
          *(int **)((long)local_38 + 8) = __position._M_current + 1;
        }
      }
      iVar8 = iVar8 + 1;
    } while (local_58._M_string_length != DAT_00136390);
    if (local_58._M_string_length == 0) break;
    _Var7._M_p = local_58._M_dataplus._M_p;
    iVar5 = bcmp(local_58._M_dataplus._M_p,EOS_abi_cxx11_,local_58._M_string_length);
  } while (iVar5 != 0);
LAB_001189fa:
  addWordNgrams(this,local_60,(vector<int,_std::allocator<int>_> *)&local_78,
                ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->wordNgrams);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((void *)local_78._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_78._M_allocated_capacity);
  }
  return iVar8;
}

Assistant:

int32_t Dictionary::getLine(
		std::istream& in,
		std::vector<int32_t>& words,
		std::vector<int32_t>& labels) const {
	std::vector<int32_t> word_hashes;
	std::string token;
	int32_t ntokens = 0;

	reset(in);
	words.clear();
	labels.clear();
	while (readWord(in, token)) {
		uint32_t h = hash(token);
		int32_t wid = getId(token, h);
		entry_type type = wid < 0 ? getType(token) : getType(wid);

		ntokens++;
		if (type == entry_type::word) {
			addSubwords(words, token, wid);
			word_hashes.push_back(h);
		} else if (type == entry_type::label && wid >= 0) {
			labels.push_back(wid - nwords_);
		}
		if (token == EOS) {
			break;
		}
	}
	addWordNgrams(words, word_hashes, args_->wordNgrams);
	return ntokens;
}